

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

void __thiscall boost::runtime::parameters_store::add(parameters_store *this,basic_param *in)

{
  pair<std::_Rb_tree_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>_>_>,_bool>
  pVar1;
  basic_param_ptr p;
  element_type *local_110;
  shared_count local_108;
  duplicate_param local_100;
  undefined **local_c8;
  iterator local_c0;
  iterator local_b8;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  duplicate_param local_90;
  specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error> local_58;
  
  (*in->_vptr_basic_param[2])(&local_110);
  if (local_110 != (element_type *)0x0) {
    local_100.
    super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>.
    super_init_error.super_param_error._0_8_ = (local_110->p_name)._M_dataplus._M_p;
    local_100.
    super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>.
    super_init_error.super_param_error.param_name.m_begin =
         (iterator)
         (local_100.
          super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>.
          super_init_error.super_param_error._0_8_ + (local_110->p_name)._M_string_length);
    local_100.
    super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>.
    super_init_error.super_param_error.param_name.m_end = (iterator)local_110;
    local_100.
    super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>.
    super_init_error.super_param_error.msg._M_dataplus._M_p = (pointer)local_108.pi_;
    if (local_108.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_108.pi_)->use_count_ = (local_108.pi_)->use_count_ + 1;
      UNLOCK();
    }
    pVar1 = std::
            _Rb_tree<boost::unit_test::basic_cstring<char_const>,std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>,std::_Select1st<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>
            ::
            _M_emplace_unique<std::pair<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>>>
                      ((_Rb_tree<boost::unit_test::basic_cstring<char_const>,std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>,std::_Select1st<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>
                        *)this,(pair<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>_>
                                *)&local_100);
    detail::shared_count::~shared_count
              ((shared_count *)
               &local_100.
                super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>
                .super_init_error.super_param_error.msg);
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      detail::shared_count::~shared_count(&local_108);
      return;
    }
    local_b0._M_p = (pointer)&local_a0;
    local_c0 = "";
    local_b8 = "";
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_c8 = &PTR__param_error_001ca200;
    specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>::operator<<
              (&local_90,
               (specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error> *)
               &local_c8,"Parameter ");
    if (local_110 != (element_type *)0x0) {
      specific_param_error<boost::runtime::duplicate_param,boost::runtime::init_error>::operator<<
                ((duplicate_param *)&local_58,
                 (specific_param_error<boost::runtime::duplicate_param,boost::runtime::init_error> *
                 )&local_90,&local_110->p_name);
      specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>::operator<<
                (&local_100,&local_58," is duplicate.");
      unit_test::ut_detail::throw_exception<boost::runtime::duplicate_param>(&local_100);
    }
  }
  __assert_fail("px != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                ,0x2de,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::basic_param>::operator->() const [T = boost::runtime::basic_param]"
               );
}

Assistant:

void                    add( basic_param const& in )
    {
        basic_param_ptr p = in.clone();

        BOOST_TEST_I_ASSRT( m_parameters.insert( std::make_pair( cstring(p->p_name), p ) ).second,
                            duplicate_param() << "Parameter " << p->p_name << " is duplicate." );
    }